

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

LocalFederateId __thiscall
helics::HandleManager::getLocalFedID(HandleManager *this,InterfaceHandle handle)

{
  _Map_pointer ppBVar1;
  BaseType BVar2;
  reference pBVar3;
  BaseType index;
  
  BVar2 = -2000000000;
  if ((-1 < handle.hid) &&
     (ppBVar1 = (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,
     handle.hid <
     (int)((int)((ulong)((long)(this->handles).
                               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->handles).
                              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * 0x286bca1b +
          (int)((ulong)((long)(this->handles).
                              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->handles).
                             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * 0x286bca1b
          + ((int)((ulong)((long)ppBVar1 -
                          (long)(this->handles).
                                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppBVar1 == (_Map_pointer)0x0)) * 3))) {
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](&(this->handles).
                           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,(ulong)(uint)handle.hid);
    BVar2 = (pBVar3->local_fed_id).fid;
  }
  return (LocalFederateId)BVar2;
}

Assistant:

LocalFederateId HandleManager::getLocalFedID(InterfaceHandle handle) const
{
    auto index = handle.baseValue();
    return (isValidIndex(index, handles)) ? handles[index].local_fed_id : LocalFederateId{};
}